

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__psd_info(stbi__context *s,int *x,int *y,int *comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi__uint32 sVar3;
  int iVar4;
  
  sVar3 = stbi__get32be(s);
  if (sVar3 != 0x38425053) goto LAB_001cb88d;
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (CONCAT11(sVar1,sVar2) != 1) goto LAB_001cb88d;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001cb7e8:
    s->img_buffer = s->img_buffer + 6;
  }
  else {
    iVar4 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (5 < iVar4) goto LAB_001cb7e8;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,6 - iVar4);
  }
  sVar1 = stbi__get8(s);
  sVar2 = stbi__get8(s);
  if (CONCAT11(sVar1,sVar2) < 0x11) {
    sVar3 = stbi__get32be(s);
    if (y != (int *)0x0) {
      *y = sVar3;
    }
    sVar3 = stbi__get32be(s);
    if (x != (int *)0x0) {
      *x = sVar3;
    }
    sVar1 = stbi__get8(s);
    sVar2 = stbi__get8(s);
    if ((CONCAT11(sVar1,sVar2) == 8) || (CONCAT11(sVar1,sVar2) == 0x10)) {
      sVar1 = stbi__get8(s);
      sVar2 = stbi__get8(s);
      if (CONCAT11(sVar1,sVar2) == 3) {
        if (comp == (int *)0x0) {
          return 1;
        }
        *comp = 4;
        return 1;
      }
    }
  }
LAB_001cb88d:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return 0;
}

Assistant:

static int stbi__psd_info(stbi__context *s, int *x, int *y, int *comp)
{
   int channelCount, dummy, depth;
   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;
   if (stbi__get32be(s) != 0x38425053) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 1) {
       stbi__rewind( s );
       return 0;
   }
   stbi__skip(s, 6);
   channelCount = stbi__get16be(s);
   if (channelCount < 0 || channelCount > 16) {
       stbi__rewind( s );
       return 0;
   }
   *y = stbi__get32be(s);
   *x = stbi__get32be(s);
   depth = stbi__get16be(s);
   if (depth != 8 && depth != 16) {
       stbi__rewind( s );
       return 0;
   }
   if (stbi__get16be(s) != 3) {
       stbi__rewind( s );
       return 0;
   }
   *comp = 4;
   return 1;
}